

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O0

REF_STATUS
ref_recon_kexact_rs(REF_GLOB center_global,REF_CLOUD ref_cloud,REF_DBL *rn,REF_DBL *sn,
                   REF_DBL *hessian)

{
  long lVar1;
  REF_GLOB local_1a8;
  REF_GLOB local_1a0;
  REF_GLOB local_198;
  REF_GLOB local_190;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_raise;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_LONG ref_private_status_reis_bi_1;
  REF_LONG ref_private_status_reis_ai_1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL verbose;
  REF_DBL xyzs [4];
  REF_INT j;
  REF_INT i;
  REF_INT im;
  REF_INT item;
  REF_GLOB cloud_global;
  REF_INT n;
  REF_INT m;
  REF_DBL *r;
  REF_DBL *q;
  REF_DBL *a;
  REF_DBL ds;
  REF_DBL dr;
  REF_DBL dq;
  REF_DBL dxyz [3];
  REF_DBL local_b8;
  REF_DBL ab [12];
  REF_DBL geom [3];
  REF_DBL *hessian_local;
  REF_DBL *sn_local;
  REF_DBL *rn_local;
  REF_CLOUD ref_cloud_local;
  REF_GLOB center_global_local;
  
  center_global_local._4_4_ = ref_cloud_item(ref_cloud,center_global,&i);
  if (center_global_local._4_4_ == 0) {
    for (xyzs[3]._4_4_ = 0; xyzs[3]._4_4_ < ref_cloud->naux; xyzs[3]._4_4_ = xyzs[3]._4_4_ + 1) {
      *(REF_DBL *)(&ref_private_macro_code_rss + (long)xyzs[3]._4_4_ * 2) =
           ref_cloud->aux[xyzs[3]._4_4_ + ref_cloud->naux * i];
    }
    cloud_global._4_4_ = ref_cloud->n + -1;
    cloud_global._0_4_ = 3;
    if (cloud_global._4_4_ < 3) {
      center_global_local._4_4_ = 4;
    }
    else if (cloud_global._4_4_ * 3 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x619
             ,"ref_recon_kexact_rs","malloc a of REF_DBL negative");
      center_global_local._4_4_ = 1;
    }
    else {
      q = (REF_DBL *)malloc((long)(cloud_global._4_4_ * 3) << 3);
      if (q == (REF_DBL *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x619,"ref_recon_kexact_rs","malloc a of REF_DBL NULL");
        center_global_local._4_4_ = 2;
      }
      else if (cloud_global._4_4_ * (int)cloud_global < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
               0x61a,"ref_recon_kexact_rs","malloc q of REF_DBL negative");
        center_global_local._4_4_ = 1;
      }
      else {
        r = (REF_DBL *)malloc((long)(cloud_global._4_4_ * (int)cloud_global) << 3);
        if (r == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x61a,"ref_recon_kexact_rs","malloc q of REF_DBL NULL");
          center_global_local._4_4_ = 2;
        }
        else if ((int)cloud_global * (int)cloud_global < 0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",
                 0x61b,"ref_recon_kexact_rs","malloc r of REF_DBL negative");
          center_global_local._4_4_ = 1;
        }
        else {
          _n = (REF_DBL *)malloc((long)((int)cloud_global * (int)cloud_global) << 3);
          if (_n == (REF_DBL *)0x0) {
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                   ,0x61b,"ref_recon_kexact_rs","malloc r of REF_DBL NULL");
            center_global_local._4_4_ = 2;
          }
          else {
            xyzs[3]._4_4_ = 0;
            i = 0;
            if (ref_cloud->n < 1) {
              local_190 = -1;
            }
            else {
              local_190 = *ref_cloud->global;
            }
            _im = local_190;
            while (i < ref_cloud->n) {
              if (center_global != _im) {
                dq = ref_cloud->aux[ref_cloud->naux * i] - _ref_private_macro_code_rss;
                dxyz[0] = ref_cloud->aux[ref_cloud->naux * i + 1] - xyzs[0];
                dxyz[1] = ref_cloud->aux[ref_cloud->naux * i + 2] - xyzs[1];
                ds = dxyz[1] * rn[2] + dq * *rn + dxyz[0] * rn[1];
                a = (REF_DBL *)(dxyz[1] * sn[2] + dq * *sn + dxyz[0] * sn[1]);
                ab[0xb] = ds * 0.5 * ds;
                for (xyzs[3]._0_4_ = 0; xyzs[3]._0_4_ < (int)cloud_global;
                    xyzs[3]._0_4_ = xyzs[3]._0_4_ + 1) {
                  q[xyzs[3]._4_4_ + cloud_global._4_4_ * xyzs[3]._0_4_] =
                       ab[(long)xyzs[3]._0_4_ + 0xb];
                }
                xyzs[3]._4_4_ = xyzs[3]._4_4_ + 1;
              }
              i = i + 1;
              if ((i < 0) || (ref_cloud->n <= i)) {
                local_198 = -1;
              }
              else {
                local_198 = ref_cloud->global[i];
              }
              _im = local_198;
            }
            if ((long)cloud_global._4_4_ == (long)xyzs[3]._4_4_) {
              center_global_local._4_4_ = ref_matrix_qr(cloud_global._4_4_,(int)cloud_global,q,r,_n)
              ;
              if (center_global_local._4_4_ == 0) {
                for (xyzs[3]._4_4_ = 0; xyzs[3]._4_4_ < ((int)cloud_global + 1) * (int)cloud_global;
                    xyzs[3]._4_4_ = xyzs[3]._4_4_ + 1) {
                  ab[(long)xyzs[3]._4_4_ + -1] = 0.0;
                }
                for (xyzs[3]._4_4_ = 0; xyzs[3]._4_4_ < (int)cloud_global;
                    xyzs[3]._4_4_ = xyzs[3]._4_4_ + 1) {
                  for (xyzs[3]._0_4_ = 0; xyzs[3]._0_4_ < (int)cloud_global;
                      xyzs[3]._0_4_ = xyzs[3]._0_4_ + 1) {
                    lVar1 = (long)(xyzs[3]._4_4_ + (int)cloud_global * xyzs[3]._0_4_);
                    ab[lVar1 + -1] =
                         _n[xyzs[3]._4_4_ + (int)cloud_global * xyzs[3]._0_4_] + ab[lVar1 + -1];
                  }
                }
                xyzs[3]._4_4_ = 0;
                i = 0;
                if (ref_cloud->n < 1) {
                  local_1a0 = -1;
                }
                else {
                  local_1a0 = *ref_cloud->global;
                }
                _im = local_1a0;
                while (i < ref_cloud->n) {
                  if (center_global != _im) {
                    dr = ref_cloud->aux[ref_cloud->naux * i + 3] - xyzs[2];
                    for (xyzs[3]._0_4_ = 0; xyzs[3]._0_4_ < (int)cloud_global;
                        xyzs[3]._0_4_ = xyzs[3]._0_4_ + 1) {
                      lVar1 = (long)(xyzs[3]._0_4_ + (int)cloud_global * (int)cloud_global);
                      ab[lVar1 + -1] =
                           r[xyzs[3]._4_4_ + cloud_global._4_4_ * xyzs[3]._0_4_] * dr +
                           ab[lVar1 + -1];
                    }
                    xyzs[3]._4_4_ = xyzs[3]._4_4_ + 1;
                  }
                  i = i + 1;
                  if ((i < 0) || (ref_cloud->n <= i)) {
                    local_1a8 = -1;
                  }
                  else {
                    local_1a8 = ref_cloud->global[i];
                  }
                  _im = local_1a8;
                }
                if ((long)cloud_global._4_4_ == (long)xyzs[3]._4_4_) {
                  center_global_local._4_4_ =
                       ref_matrix_solve_ab((int)cloud_global,(int)cloud_global + 1,&local_b8);
                  if (center_global_local._4_4_ == 0) {
                    xyzs[3]._0_4_ = (int)cloud_global;
                    for (j = 0; j < 3; j = j + 1) {
                      hessian[j] = ab[(long)(j + (int)cloud_global * (int)cloud_global) + -1];
                    }
                    if (_n != (REF_DBL *)0x0) {
                      free(_n);
                    }
                    if (r != (REF_DBL *)0x0) {
                      free(r);
                    }
                    if (q != (REF_DBL *)0x0) {
                      free(q);
                    }
                    center_global_local._4_4_ = 0;
                  }
                }
                else {
                  printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                         ,0x640,"ref_recon_kexact_rs","b row miscount",(long)cloud_global._4_4_,
                         (long)xyzs[3]._4_4_);
                  center_global_local._4_4_ = 1;
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                       ,0x62f,"ref_recon_kexact_rs",(ulong)center_global_local._4_4_,
                       "kexact lsq hess qr");
              }
            }
            else {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c"
                     ,0x62e,"ref_recon_kexact_rs","A row miscount",(long)cloud_global._4_4_,
                     (long)xyzs[3]._4_4_);
              center_global_local._4_4_ = 1;
            }
          }
        }
      }
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",0x60a,
           "ref_recon_kexact_rs",(ulong)center_global_local._4_4_,"missing center");
  }
  return center_global_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_recon_kexact_rs(REF_GLOB center_global,
                                       REF_CLOUD ref_cloud, REF_DBL *rn,
                                       REF_DBL *sn, REF_DBL *hessian) {
  REF_DBL geom[3], ab[12];
  REF_DBL dxyz[3], dq, dr, ds;
  REF_DBL *a, *q, *r;
  REF_INT m, n;
  REF_GLOB cloud_global;
  REF_INT item, im, i, j;
  REF_DBL xyzs[4];
  REF_BOOL verbose = REF_FALSE;

  RSS(ref_cloud_item(ref_cloud, center_global, &item), "missing center");
  each_ref_cloud_aux(ref_cloud, i) {
    xyzs[i] = ref_cloud_aux(ref_cloud, i, item);
  }
  /* solve A with QR factorization size m x n */
  m = ref_cloud_n(ref_cloud) - 1; /* skip self */
  n = 3;
  if (verbose)
    printf("m %d at %f %f %f %f\n", m, xyzs[0], xyzs[1], xyzs[2], xyzs[3]);
  if (verbose)
    printf("r %f %f %f\ns %f %f %f\n", rn[0], rn[1], rn[2], sn[0], sn[1],
           sn[2]);
  if (m < n) {           /* underdetermined, will end badly */
    return REF_DIV_ZERO; /* signal cloud growth required */
  }
  ref_malloc(a, m * n, REF_DBL);
  ref_malloc(q, m * n, REF_DBL);
  ref_malloc(r, n * n, REF_DBL);
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dxyz[0] = ref_cloud_aux(ref_cloud, 0, item) - xyzs[0];
    dxyz[1] = ref_cloud_aux(ref_cloud, 1, item) - xyzs[1];
    dxyz[2] = ref_cloud_aux(ref_cloud, 2, item) - xyzs[2];
    dr = ref_math_dot(dxyz, rn);
    ds = ref_math_dot(dxyz, sn);
    geom[0] = 0.5 * dr * dr;
    geom[1] = dr * ds;
    geom[2] = 0.5 * ds * ds;
    for (j = 0; j < n; j++) {
      a[i + m * j] = geom[j];
      if (verbose) printf(" %12.4e", geom[j]);
    }
    if (verbose) printf(" %f %f %d\n", dr, ds, i);
    i++;
  }
  REIS(m, i, "A row miscount");
  RSS(ref_matrix_qr(m, n, a, q, r), "kexact lsq hess qr");
  if (verbose) RSS(ref_matrix_show_aqr(m, n, a, q, r), "show qr");
  for (i = 0; i < (n + 1) * n; i++) ab[i] = 0.0;
  for (i = 0; i < n; i++) {
    for (j = 0; j < n; j++) {
      ab[i + n * j] += r[i + n * j];
    }
  }
  i = 0;
  each_ref_cloud_global(ref_cloud, item, cloud_global) {
    if (center_global == cloud_global) continue; /* skip self */
    dq = ref_cloud_aux(ref_cloud, 3, item) - xyzs[3];
    for (j = 0; j < n; j++) {
      ab[j + n * n] += q[i + m * j] * dq;
    }
    i++;
  }
  REIS(m, i, "b row miscount");
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  RAISE(ref_matrix_solve_ab(n, n + 1, ab));
  if (verbose) RSS(ref_matrix_show_ab(n, n + 1, ab), "show");
  j = n;
  for (im = 0; im < 3; im++) {
    hessian[im] = ab[im + n * j];
  }
  ref_free(r);
  ref_free(q);
  ref_free(a);

  return REF_SUCCESS;
}